

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void completeMessages(UA_Server *server,UA_Job *job)

{
  UA_StatusCode UVar1;
  UA_Boolean local_19;
  UA_StatusCode retval;
  UA_Boolean realloced;
  UA_Job *job_local;
  UA_Server *server_local;
  
  local_19 = false;
  _retval = job;
  job_local = (UA_Job *)server;
  UVar1 = UA_Connection_completeMessages
                    ((job->job).closeConnection,&(job->job).binaryMessage.message,&local_19);
  if (UVar1 == 0) {
    if ((local_19 & 1U) != 0) {
      _retval->type = UA_JOBTYPE_BINARYMESSAGE_ALLOCATED;
    }
    if ((_retval->job).binaryMessage.message.length == 0) {
      _retval->type = UA_JOBTYPE_NOTHING;
    }
  }
  else {
    if (UVar1 == 0x80030000) {
      UA_LOG_WARNING(*(UA_Logger *)(job_local + 4),UA_LOGCATEGORY_NETWORK,
                     "Lost message(s) from Connection %i as memory could not be allocated",
                     (ulong)(uint)((_retval->job).closeConnection)->sockfd);
    }
    else if (UVar1 != 0) {
      UA_LOG_INFO(*(UA_Logger *)(job_local + 4),UA_LOGCATEGORY_NETWORK,
                  "Could not merge half-received messages on Connection %i with error 0x%08x",
                  (ulong)(uint)((_retval->job).closeConnection)->sockfd,(ulong)UVar1);
    }
    _retval->type = UA_JOBTYPE_NOTHING;
  }
  return;
}

Assistant:

static void
completeMessages(UA_Server *server, UA_Job *job) {
    UA_Boolean realloced = UA_FALSE;
    UA_StatusCode retval = UA_Connection_completeMessages(job->job.binaryMessage.connection,
                                                          &job->job.binaryMessage.message, &realloced);
    if(retval != UA_STATUSCODE_GOOD) {
        if(retval == UA_STATUSCODE_BADOUTOFMEMORY)
            UA_LOG_WARNING(server->config.logger, UA_LOGCATEGORY_NETWORK,
                           "Lost message(s) from Connection %i as memory could not be allocated",
                           job->job.binaryMessage.connection->sockfd);
        else if(retval != UA_STATUSCODE_GOOD)
            UA_LOG_INFO(server->config.logger, UA_LOGCATEGORY_NETWORK,
                        "Could not merge half-received messages on Connection %i with error 0x%08x",
                        job->job.binaryMessage.connection->sockfd, retval);
        job->type = UA_JOBTYPE_NOTHING;
        return;
    }
    if(realloced)
        job->type = UA_JOBTYPE_BINARYMESSAGE_ALLOCATED;

    /* discard the job if message is empty - also no leak is possible here */
    if(job->job.binaryMessage.message.length == 0)
        job->type = UA_JOBTYPE_NOTHING;
}